

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Stack.h
# Opt level: O1

void __thiscall w3Stack::AssertTopIsValue(w3Stack *this)

{
  pointer extraout_RAX;
  pointer pwVar1;
  undefined8 extraout_RAX_00;
  string local_28;
  
  DumpStack(this,"AssertTopIsValue");
  if ((this->super_w3StackBase).super_w3StackBaseBase.
      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->super_w3StackBase).super_w3StackBaseBase.
      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    StringFormat_abi_cxx11_(&local_28,"%lX",0);
    AssertFailedFormat("size () >= 1",&local_28);
    pwVar1 = extraout_RAX;
  }
  else {
    pwVar1 = (this->super_w3StackBase).super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  StringFormat_abi_cxx11_(&local_28,"%X %X",(ulong)pwVar1[-1].tag,0x80);
  AssertFailedFormat("top ().tag == Tag_Value",&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

void AssertTopIsValue ()
    {
        if (size () < 1 || top ().tag != Tag_Value)
            DumpStack ("AssertTopIsValue");
        AssertFormat (size () >= 1, ("%" FORMAT_SIZE "X", size ()));
        AssertFormat (top ().tag == Tag_Value, ("%X %X", top ().tag, Tag_Value));
    }